

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ParseAttrMeta(AsciiParser *this,AttrMeta *out_meta)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  string *psVar4;
  value_type *def;
  mapped_type *pmVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string local_1c88;
  allocator local_1c61;
  string local_1c60 [32];
  fmt local_1c40 [32];
  ostringstream local_1c20 [8];
  ostringstream ss_e_12;
  value_type *vardef;
  MetaVariable metavar_2;
  undefined1 local_19f8 [8];
  optional<tinyusdz::ascii::AsciiParser::VariableDef> pv;
  Dictionary dict_1;
  ostringstream local_1938 [8];
  ostringstream ss_e_11;
  undefined1 local_17c0 [8];
  token tok_4;
  ostringstream local_1780 [8];
  ostringstream ss_e_10;
  undefined1 local_1608 [8];
  token tok_3;
  ostringstream local_15c8 [8];
  ostringstream ss_e_9;
  undefined1 local_1450 [8];
  token tok_2;
  ostringstream local_1410 [8];
  ostringstream ss_e_8;
  undefined1 local_1298 [8];
  string str_1;
  ostringstream local_1258 [8];
  ostringstream ss_e_7;
  undefined1 local_10e0 [8];
  string str;
  ostringstream local_10a0 [8];
  ostringstream ss_w;
  string local_f28;
  ostringstream local_f08 [8];
  ostringstream ss_e_6;
  undefined1 local_d90 [8];
  token tok_1;
  string local_d60;
  ostringstream local_d40 [8];
  ostringstream ss_e_5;
  double local_bc8;
  double value_3;
  Dictionary dict;
  key_type local_b88 [4];
  allocator local_b61;
  string local_b60;
  undefined1 local_b40 [8];
  MetaVariable metavar_1;
  ostringstream local_ae8 [8];
  ostringstream ss_e_4;
  int local_970;
  allocator local_969;
  int value_2;
  allocator local_941;
  string local_940;
  undefined1 local_920 [8];
  MetaVariable metavar;
  ostringstream local_8c8 [8];
  ostringstream ss_e_3;
  undefined1 local_750 [8];
  token tok;
  string local_728;
  ostringstream local_708 [8];
  ostringstream ss_e_2;
  uint32_t local_58c;
  uint32_t value_1;
  undefined1 local_580 [8];
  string value;
  allocator local_539;
  string local_538 [32];
  string local_518;
  ostringstream local_4f8 [8];
  ostringstream ss_e_1;
  allocator local_379;
  string local_378;
  Path local_358;
  undefined1 local_288 [8];
  string name_err;
  allocator local_241;
  string local_240 [32];
  fmt local_220 [32];
  ostringstream local_200 [8];
  ostringstream ss_e;
  undefined1 local_80 [7];
  bool supported;
  string varname;
  undefined1 local_58 [8];
  StringData sdata;
  char c_1;
  char c;
  AttrMeta *out_meta_local;
  AsciiParser *this_local;
  
  bVar1 = SkipWhitespace(this);
  if (bVar1) {
    bVar1 = Char1(this,&sdata.field_0x2f);
    if (bVar1) {
      if (sdata._47_1_ == '(') {
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (bVar1) {
LAB_00553577:
          do {
            bVar1 = Eof(this);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_00554fc4:
              this_local._7_1_ = 1;
              break;
            }
            bVar1 = Char1(this,&sdata.field_0x2e);
            if (!bVar1) {
              this_local._7_1_ = 0;
              break;
            }
            if (sdata._46_1_ == ')') goto LAB_00554fc4;
            bVar1 = Rewind(this,1);
            if (!bVar1) {
              this_local._7_1_ = 0;
              break;
            }
            tinyusdz::value::StringData::StringData((StringData *)local_58);
            bVar1 = MaybeTripleQuotedString(this,(StringData *)local_58);
            if (bVar1) {
              ::std::
              vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
              push_back(&out_meta->stringData,(value_type *)local_58);
              bVar1 = SkipWhitespaceAndNewline(this,true);
              if (bVar1) {
                varname.field_2._12_4_ = 2;
              }
              else {
                this_local._7_1_ = 0;
                varname.field_2._12_4_ = 1;
              }
            }
            else {
              bVar1 = MaybeString(this,(StringData *)local_58);
              if (bVar1) {
                ::std::
                vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
                push_back(&out_meta->stringData,(value_type *)local_58);
                bVar1 = SkipWhitespaceAndNewline(this,true);
                if (bVar1) {
                  varname.field_2._12_4_ = 2;
                }
                else {
                  this_local._7_1_ = 0;
                  varname.field_2._12_4_ = 1;
                }
              }
              else {
                varname.field_2._12_4_ = 0;
              }
            }
            tinyusdz::value::StringData::~StringData((StringData *)local_58);
            if (varname.field_2._12_4_ != 0) {
              if (varname.field_2._12_4_ == 1) break;
              goto LAB_00553577;
            }
            ::std::__cxx11::string::string((string *)local_80);
            bVar1 = ReadIdentifier(this,(string *)local_80);
            if (bVar1) {
              sVar2 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
                      ::count(&this->_supported_prop_metas,(key_type *)local_80);
              if (sVar2 == 0) {
                ::std::__cxx11::ostringstream::ostringstream(local_200);
                poVar3 = ::std::operator<<((ostream *)local_200,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,"[ASCII]");
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseAttrMeta");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xce0);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_240,"Unsupported Property metadatum name: {}",&local_241);
                fmt::format<std::__cxx11::string>
                          (local_220,(string *)local_240,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80);
                poVar3 = ::std::operator<<((ostream *)local_200,(string *)local_220);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_220);
                ::std::__cxx11::string::~string(local_240);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_241);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)((long)&name_err.field_2 + 8));
                ::std::__cxx11::string::~string((string *)(name_err.field_2._M_local_buf + 8));
                this_local._7_1_ = 0;
                varname.field_2._12_4_ = 1;
                ::std::__cxx11::ostringstream::~ostringstream(local_200);
              }
              else {
                ::std::__cxx11::string::string((string *)local_288);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)&local_378,"",&local_379);
                Path::Path(&local_358,&local_378,(string *)local_80);
                bVar1 = pathutil::ValidatePropPath(&local_358,(string *)local_288);
                Path::~Path(&local_358);
                ::std::__cxx11::string::~string((string *)&local_378);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_379);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  varname.field_2._12_4_ = 0;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_4f8);
                  poVar3 = ::std::operator<<((ostream *)local_4f8,"[error]");
                  poVar3 = ::std::operator<<(poVar3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                            );
                  poVar3 = ::std::operator<<(poVar3,"[ASCII]");
                  poVar3 = ::std::operator<<(poVar3,":");
                  poVar3 = ::std::operator<<(poVar3,"ParseAttrMeta");
                  poVar3 = ::std::operator<<(poVar3,"():");
                  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xce8);
                  ::std::operator<<(poVar3," ");
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_538,"Invalid Property name `{}`: {}",&local_539);
                  fmt::format<std::__cxx11::string,std::__cxx11::string>
                            (&local_518,(fmt *)local_538,(string *)local_80,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_288,in_R8);
                  poVar3 = ::std::operator<<((ostream *)local_4f8,(string *)&local_518);
                  ::std::operator<<(poVar3,"\n");
                  ::std::__cxx11::string::~string((string *)&local_518);
                  ::std::__cxx11::string::~string(local_538);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_539);
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,(string *)((long)&value.field_2 + 8));
                  ::std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
                  this_local._7_1_ = 0;
                  varname.field_2._12_4_ = 1;
                  ::std::__cxx11::ostringstream::~ostringstream(local_4f8);
                }
                ::std::__cxx11::string::~string((string *)local_288);
                if (varname.field_2._12_4_ == 0) {
                  bVar1 = SkipWhitespaceAndNewline(this,true);
                  if (bVar1) {
                    bVar1 = Expect(this,'=');
                    if (bVar1) {
                      bVar1 = SkipWhitespaceAndNewline(this,true);
                      if (bVar1) {
                        bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"interpolation");
                        if (bVar1) {
                          ::std::__cxx11::string::string((string *)local_580);
                          bVar1 = ReadStringLiteral(this,(string *)local_580);
                          if (bVar1) {
                            InterpolationFromString
                                      ((optional<tinyusdz::Interpolation> *)&stack0xfffffffffffffa78
                                       ,(string *)local_580);
                            nonstd::optional_lite::optional<tinyusdz::Interpolation>::operator=
                                      (&out_meta->interpolation,
                                       (optional<tinyusdz::Interpolation> *)&stack0xfffffffffffffa78
                                      );
                            nonstd::optional_lite::optional<tinyusdz::Interpolation>::~optional
                                      ((optional<tinyusdz::Interpolation> *)&stack0xfffffffffffffa78
                                      );
                          }
                          else {
                            this_local._7_1_ = 0;
                          }
                          varname.field_2._13_3_ = 0;
                          varname.field_2._M_local_buf[0xc] = !bVar1;
                          ::std::__cxx11::string::~string((string *)local_580);
joined_r0x005549b4:
                          if (varname.field_2._12_4_ != 0) goto LAB_00554fa9;
                        }
                        else {
                          bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"elementSize");
                          if (!bVar1) {
                            bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"colorSpace");
                            if (bVar1) {
                              Token::Token((Token *)local_750);
                              bVar1 = ReadBasicType(this,(token *)local_750);
                              if (bVar1) {
                                MetaVariable::MetaVariable((MetaVariable *)local_920);
                                ::std::allocator<char>::allocator();
                                ::std::__cxx11::string::string
                                          ((string *)&local_940,"colorSpace",&local_941);
                                MetaVariable::set_value<tinyusdz::Token>
                                          ((MetaVariable *)local_920,&local_940,(Token *)local_750);
                                ::std::__cxx11::string::~string((string *)&local_940);
                                ::std::allocator<char>::~allocator((allocator<char> *)&local_941);
                                ::std::allocator<char>::allocator();
                                ::std::__cxx11::string::string
                                          ((string *)&value_2,"colorSpace",&local_969);
                                pmVar5 = ::std::
                                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                         ::operator[](&out_meta->meta,(key_type *)&value_2);
                                MetaVariable::operator=(pmVar5,(MetaVariable *)local_920);
                                ::std::__cxx11::string::~string((string *)&value_2);
                                ::std::allocator<char>::~allocator((allocator<char> *)&local_969);
                                MetaVariable::~MetaVariable((MetaVariable *)local_920);
                                varname.field_2._12_4_ = 0;
                              }
                              else {
                                ::std::__cxx11::ostringstream::ostringstream(local_8c8);
                                poVar3 = ::std::operator<<((ostream *)local_8c8,"[error]");
                                poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                poVar3 = ::std::operator<<(poVar3,":");
                                poVar3 = ::std::operator<<(poVar3,"ParseAttrMeta");
                                poVar3 = ::std::operator<<(poVar3,"():");
                                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xd0e);
                                ::std::operator<<(poVar3," ");
                                poVar3 = ::std::operator<<((ostream *)local_8c8,
                                                           "Failed to parse `colorSpace`");
                                ::std::operator<<(poVar3,"\n");
                                ::std::__cxx11::ostringstream::str();
                                PushError(this,(string *)((long)&metavar._name.field_2 + 8));
                                ::std::__cxx11::string::~string
                                          ((string *)(metavar._name.field_2._M_local_buf + 8));
                                this_local._7_1_ = 0;
                                varname.field_2._12_4_ = 1;
                                ::std::__cxx11::ostringstream::~ostringstream(local_8c8);
                              }
                              Token::~Token((Token *)local_750);
                            }
                            else {
                              bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"unauthoredValuesIndex");
                              if (bVar1) {
                                bVar1 = ReadBasicType(this,&local_970);
                                if (bVar1) {
                                  MetaVariable::MetaVariable((MetaVariable *)local_b40);
                                  ::std::allocator<char>::allocator();
                                  ::std::__cxx11::string::string
                                            ((string *)&local_b60,"unauthoredValuesIndex",&local_b61
                                            );
                                  MetaVariable::set_value<int>
                                            ((MetaVariable *)local_b40,&local_b60,&local_970);
                                  ::std::__cxx11::string::~string((string *)&local_b60);
                                  ::std::allocator<char>::~allocator((allocator<char> *)&local_b61);
                                  ::std::allocator<char>::allocator();
                                  ::std::__cxx11::string::string
                                            ((string *)local_b88,"unauthoredValuesIndex",
                                             (allocator *)
                                             ((long)&dict._M_t._M_impl.super__Rb_tree_header.
                                                     _M_node_count + 7));
                                  pmVar5 = ::std::
                                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                           ::operator[](&out_meta->meta,local_b88);
                                  MetaVariable::operator=(pmVar5,(MetaVariable *)local_b40);
                                  ::std::__cxx11::string::~string((string *)local_b88);
                                  ::std::allocator<char>::~allocator
                                            ((allocator<char> *)
                                             ((long)&dict._M_t._M_impl.super__Rb_tree_header.
                                                     _M_node_count + 7));
                                  MetaVariable::~MetaVariable((MetaVariable *)local_b40);
                                  goto LAB_00554f80;
                                }
                                ::std::__cxx11::ostringstream::ostringstream(local_ae8);
                                poVar3 = ::std::operator<<((ostream *)local_ae8,"[error]");
                                poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                poVar3 = ::std::operator<<(poVar3,":");
                                poVar3 = ::std::operator<<(poVar3,"ParseAttrMeta");
                                poVar3 = ::std::operator<<(poVar3,"():");
                                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xd17);
                                ::std::operator<<(poVar3," ");
                                poVar3 = ::std::operator<<((ostream *)local_ae8,
                                                           "Failed to parse `unauthoredValuesIndex`"
                                                          );
                                ::std::operator<<(poVar3,"\n");
                                ::std::__cxx11::ostringstream::str();
                                PushError(this,(string *)((long)&metavar_1._name.field_2 + 8));
                                ::std::__cxx11::string::~string
                                          ((string *)(metavar_1._name.field_2._M_local_buf + 8));
                                this_local._7_1_ = 0;
                                varname.field_2._12_4_ = 1;
                                ::std::__cxx11::ostringstream::~ostringstream(local_ae8);
                                goto LAB_00554fa9;
                              }
                              bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"customData");
                              if (bVar1) {
                                ::std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                       *)&value_3);
                                bVar1 = ParseDict(this,(
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                  *)&value_3);
                                if (bVar1) {
                                  nonstd::optional_lite::
                                  optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                                  ::operator=((optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                                               *)&out_meta->customData,
                                              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                               *)&value_3);
                                }
                                else {
                                  this_local._7_1_ = 0;
                                }
                                varname.field_2._13_3_ = 0;
                                varname.field_2._M_local_buf[0xc] = !bVar1;
                                ::std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                        *)&value_3);
                              }
                              else {
                                bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"weight");
                                if (bVar1) {
                                  bVar1 = ReadBasicType(this,&local_bc8);
                                  if (bVar1) {
                                    nonstd::optional_lite::optional<double>::optional<double_&,_0>
                                              ((optional<double> *)((long)&tok_1.str_.field_2 + 8),
                                               &local_bc8);
                                    nonstd::optional_lite::optional<double>::operator=
                                              (&out_meta->weight,
                                               (optional<double> *)((long)&tok_1.str_.field_2 + 8));
                                    nonstd::optional_lite::optional<double>::~optional
                                              ((optional<double> *)((long)&tok_1.str_.field_2 + 8));
                                    goto LAB_00554f80;
                                  }
                                  ::std::__cxx11::ostringstream::ostringstream(local_d40);
                                  poVar3 = ::std::operator<<((ostream *)local_d40,"[error]");
                                  poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                  poVar3 = ::std::operator<<(poVar3,":");
                                  poVar3 = ::std::operator<<(poVar3,"ParseAttrMeta");
                                  poVar3 = ::std::operator<<(poVar3,"():");
                                  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xd2b);
                                  ::std::operator<<(poVar3," ");
                                  poVar3 = ::std::operator<<((ostream *)local_d40,
                                                             "Failed to parse `weight`");
                                  ::std::operator<<(poVar3,"\n");
                                  ::std::__cxx11::ostringstream::str();
                                  PushError(this,&local_d60);
                                  ::std::__cxx11::string::~string((string *)&local_d60);
                                  this_local._7_1_ = 0;
                                  varname.field_2._12_4_ = 1;
                                  ::std::__cxx11::ostringstream::~ostringstream(local_d40);
                                  goto LAB_00554fa9;
                                }
                                bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"bindMaterialAs");
                                if (bVar1) {
                                  Token::Token((Token *)local_d90);
                                  bVar1 = ReadBasicType(this,(token *)local_d90);
                                  if (bVar1) {
                                    psVar4 = Token::str_abi_cxx11_((Token *)local_d90);
                                    bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)psVar4,"weakerThanDescendants");
                                    if (!bVar1) {
                                      psVar4 = Token::str_abi_cxx11_((Token *)local_d90);
                                      bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)psVar4,"strongerThanDescendants");
                                      if (!bVar1) {
                                        ::std::__cxx11::ostringstream::ostringstream(local_10a0);
                                        poVar3 = ::std::operator<<((ostream *)local_10a0,"[warn]");
                                        poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                        poVar3 = ::std::operator<<(poVar3,":");
                                        poVar3 = ::std::operator<<(poVar3,"ParseAttrMeta");
                                        poVar3 = ::std::operator<<(poVar3,"():");
                                        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xd3a)
                                        ;
                                        ::std::operator<<(poVar3," ");
                                        poVar3 = ::std::operator<<((ostream *)local_10a0,
                                                                                                                                      
                                                  "Unsupported token for bindMaterialAs: ");
                                        psVar4 = Token::str_abi_cxx11_((Token *)local_d90);
                                        poVar3 = ::std::operator<<(poVar3,(string *)psVar4);
                                        ::std::operator<<(poVar3,"\n");
                                        ::std::__cxx11::ostringstream::str();
                                        PushWarn(this,(string *)((long)&str.field_2 + 8));
                                        ::std::__cxx11::string::~string
                                                  ((string *)(str.field_2._M_local_buf + 8));
                                        ::std::__cxx11::ostringstream::~ostringstream(local_10a0);
                                      }
                                    }
                                    nonstd::optional_lite::optional<tinyusdz::Token>::operator=
                                              (&out_meta->bindMaterialAs,(Token *)local_d90);
                                    varname.field_2._12_4_ = 0;
                                  }
                                  else {
                                    ::std::__cxx11::ostringstream::ostringstream(local_f08);
                                    poVar3 = ::std::operator<<((ostream *)local_f08,"[error]");
                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                    poVar3 = ::std::operator<<(poVar3,":");
                                    poVar3 = ::std::operator<<(poVar3,"ParseAttrMeta");
                                    poVar3 = ::std::operator<<(poVar3,"():");
                                    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xd33);
                                    ::std::operator<<(poVar3," ");
                                    poVar3 = ::std::operator<<((ostream *)local_f08,
                                                               "Failed to parse `bindMaterialAs`");
                                    ::std::operator<<(poVar3,"\n");
                                    ::std::__cxx11::ostringstream::str();
                                    PushError(this,&local_f28);
                                    ::std::__cxx11::string::~string((string *)&local_f28);
                                    this_local._7_1_ = 0;
                                    varname.field_2._12_4_ = 1;
                                    ::std::__cxx11::ostringstream::~ostringstream(local_f08);
                                  }
                                  Token::~Token((Token *)local_d90);
                                }
                                else {
                                  bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"displayName");
                                  if (bVar1) {
                                    ::std::__cxx11::string::string((string *)local_10e0);
                                    bVar1 = ReadStringLiteral(this,(string *)local_10e0);
                                    if (bVar1) {
                                      nonstd::optional_lite::optional<std::__cxx11::string>::
                                      operator=((optional<std::__cxx11::string> *)
                                                &out_meta->displayName,
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_10e0);
                                      varname.field_2._12_4_ = 0;
                                    }
                                    else {
                                      ::std::__cxx11::ostringstream::ostringstream(local_1258);
                                      poVar3 = ::std::operator<<((ostream *)local_1258,"[error]");
                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                      poVar3 = ::std::operator<<(poVar3,":");
                                      poVar3 = ::std::operator<<(poVar3,"ParseAttrMeta");
                                      poVar3 = ::std::operator<<(poVar3,"():");
                                      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xd41);
                                      ::std::operator<<(poVar3," ");
                                      poVar3 = ::std::operator<<((ostream *)local_1258,
                                                                                                                                  
                                                  "Failed to parse `displayName`(string type)");
                                      ::std::operator<<(poVar3,"\n");
                                      ::std::__cxx11::ostringstream::str();
                                      PushError(this,(string *)((long)&str_1.field_2 + 8));
                                      ::std::__cxx11::string::~string
                                                ((string *)(str_1.field_2._M_local_buf + 8));
                                      this_local._7_1_ = 0;
                                      varname.field_2._12_4_ = 1;
                                      ::std::__cxx11::ostringstream::~ostringstream(local_1258);
                                    }
                                    ::std::__cxx11::string::~string((string *)local_10e0);
                                  }
                                  else {
                                    bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"displayGroup");
                                    if (bVar1) {
                                      ::std::__cxx11::string::string((string *)local_1298);
                                      bVar1 = ReadStringLiteral(this,(string *)local_1298);
                                      if (bVar1) {
                                        nonstd::optional_lite::optional<std::__cxx11::string>::
                                        operator=((optional<std::__cxx11::string> *)
                                                  &out_meta->displayGroup,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1298);
                                        varname.field_2._12_4_ = 0;
                                      }
                                      else {
                                        ::std::__cxx11::ostringstream::ostringstream(local_1410);
                                        poVar3 = ::std::operator<<((ostream *)local_1410,"[error]");
                                        poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                        poVar3 = ::std::operator<<(poVar3,":");
                                        poVar3 = ::std::operator<<(poVar3,"ParseAttrMeta");
                                        poVar3 = ::std::operator<<(poVar3,"():");
                                        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xd48)
                                        ;
                                        ::std::operator<<(poVar3," ");
                                        poVar3 = ::std::operator<<((ostream *)local_1410,
                                                                                                                                      
                                                  "Failed to parse `displayGroup`(string type)");
                                        ::std::operator<<(poVar3,"\n");
                                        ::std::__cxx11::ostringstream::str();
                                        PushError(this,(string *)((long)&tok_2.str_.field_2 + 8));
                                        ::std::__cxx11::string::~string
                                                  ((string *)(tok_2.str_.field_2._M_local_buf + 8));
                                        this_local._7_1_ = 0;
                                        varname.field_2._12_4_ = 1;
                                        ::std::__cxx11::ostringstream::~ostringstream(local_1410);
                                      }
                                      ::std::__cxx11::string::~string((string *)local_1298);
                                    }
                                    else {
                                      bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"connectability");
                                      if (bVar1) {
                                        Token::Token((Token *)local_1450);
                                        bVar1 = ReadBasicType(this,(token *)local_1450);
                                        if (bVar1) {
                                          nonstd::optional_lite::optional<tinyusdz::Token>::
                                          operator=(&out_meta->connectability,(Token *)local_1450);
                                          varname.field_2._12_4_ = 0;
                                        }
                                        else {
                                          ::std::__cxx11::ostringstream::ostringstream(local_15c8);
                                          poVar3 = ::std::operator<<((ostream *)local_15c8,"[error]"
                                                                    );
                                          poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                          poVar3 = ::std::operator<<(poVar3,":");
                                          poVar3 = ::std::operator<<(poVar3,"ParseAttrMeta");
                                          poVar3 = ::std::operator<<(poVar3,"():");
                                          poVar3 = (ostream *)
                                                   ::std::ostream::operator<<(poVar3,0xd50);
                                          ::std::operator<<(poVar3," ");
                                          poVar3 = ::std::operator<<((ostream *)local_15c8,
                                                                                                                                          
                                                  "Failed to parse `connectability`");
                                          ::std::operator<<(poVar3,"\n");
                                          ::std::__cxx11::ostringstream::str();
                                          PushError(this,(string *)((long)&tok_3.str_.field_2 + 8));
                                          ::std::__cxx11::string::~string
                                                    ((string *)(tok_3.str_.field_2._M_local_buf + 8)
                                                    );
                                          this_local._7_1_ = 0;
                                          varname.field_2._12_4_ = 1;
                                          ::std::__cxx11::ostringstream::~ostringstream(local_15c8);
                                        }
                                        Token::~Token((Token *)local_1450);
                                      }
                                      else {
                                        bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"renderType");
                                        if (bVar1) {
                                          Token::Token((Token *)local_1608);
                                          bVar1 = ReadBasicType(this,(token *)local_1608);
                                          if (bVar1) {
                                            nonstd::optional_lite::optional<tinyusdz::Token>::
                                            operator=(&out_meta->renderType,(Token *)local_1608);
                                            varname.field_2._12_4_ = 0;
                                          }
                                          else {
                                            ::std::__cxx11::ostringstream::ostringstream(local_1780)
                                            ;
                                            poVar3 = ::std::operator<<((ostream *)local_1780,
                                                                       "[error]");
                                            poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                            poVar3 = ::std::operator<<(poVar3,":");
                                            poVar3 = ::std::operator<<(poVar3,"ParseAttrMeta");
                                            poVar3 = ::std::operator<<(poVar3,"():");
                                            poVar3 = (ostream *)
                                                     ::std::ostream::operator<<(poVar3,0xd57);
                                            ::std::operator<<(poVar3," ");
                                            poVar3 = ::std::operator<<((ostream *)local_1780,
                                                                                                                                              
                                                  "Failed to parse `renderType`");
                                            ::std::operator<<(poVar3,"\n");
                                            ::std::__cxx11::ostringstream::str();
                                            PushError(this,(string *)((long)&tok_4.str_.field_2 + 8)
                                                     );
                                            ::std::__cxx11::string::~string
                                                      ((string *)
                                                       (tok_4.str_.field_2._M_local_buf + 8));
                                            this_local._7_1_ = 0;
                                            varname.field_2._12_4_ = 1;
                                            ::std::__cxx11::ostringstream::~ostringstream
                                                      (local_1780);
                                          }
                                          Token::~Token((Token *)local_1608);
                                        }
                                        else {
                                          bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"outputName");
                                          if (bVar1) {
                                            Token::Token((Token *)local_17c0);
                                            bVar1 = ReadBasicType(this,(token *)local_17c0);
                                            if (bVar1) {
                                              nonstd::optional_lite::optional<tinyusdz::Token>::
                                              operator=(&out_meta->outputName,(Token *)local_17c0);
                                              varname.field_2._12_4_ = 0;
                                            }
                                            else {
                                              ::std::__cxx11::ostringstream::ostringstream
                                                        (local_1938);
                                              poVar3 = ::std::operator<<((ostream *)local_1938,
                                                                         "[error]");
                                              poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                              poVar3 = ::std::operator<<(poVar3,":");
                                              poVar3 = ::std::operator<<(poVar3,"ParseAttrMeta");
                                              poVar3 = ::std::operator<<(poVar3,"():");
                                              poVar3 = (ostream *)
                                                       ::std::ostream::operator<<(poVar3,0xd5e);
                                              ::std::operator<<(poVar3," ");
                                              poVar3 = ::std::operator<<((ostream *)local_1938,
                                                                                                                                                  
                                                  "Failed to parse `outputName`");
                                              ::std::operator<<(poVar3,"\n");
                                              ::std::__cxx11::ostringstream::str();
                                              PushError(this,(string *)
                                                             &dict_1._M_t._M_impl.
                                                              super__Rb_tree_header._M_node_count);
                                              ::std::__cxx11::string::~string
                                                        ((string *)
                                                         &dict_1._M_t._M_impl.super__Rb_tree_header.
                                                          _M_node_count);
                                              this_local._7_1_ = 0;
                                              varname.field_2._12_4_ = 1;
                                              ::std::__cxx11::ostringstream::~ostringstream
                                                        (local_1938);
                                            }
                                            Token::~Token((Token *)local_17c0);
                                          }
                                          else {
                                            bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"sdrMetadata");
                                            if (bVar1) {
                                              ::std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                              ::map((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                  *)((long)&pv.contained + 0x60));
                                              bVar1 = ParseDict(this,(
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                  *)((long)&pv.contained + 0x60));
                                              if (bVar1) {
                                                nonstd::optional_lite::
                                                optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                                                ::operator=((
                                                  optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                                                  *)&out_meta->sdrMetadata,
                                                  (
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                  *)((long)&pv.contained + 0x60));
                                              }
                                              else {
                                                this_local._7_1_ = 0;
                                              }
                                              varname.field_2._13_3_ = 0;
                                              varname.field_2._M_local_buf[0xc] = !bVar1;
                                              ::std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                              ::~map((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                  *)((long)&pv.contained + 0x60));
                                            }
                                            else {
                                              GetPropMetaDefinition
                                                        ((
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)((long)&metavar_2._name.field_2 + 8),this,
                                                  (string *)local_80);
                                              nonstd::optional_lite::
                                              optional<tinyusdz::ascii::AsciiParser::VariableDef>::
                                              optional<tinyusdz::ascii::AsciiParser::VariableDef,_0>
                                                        ((
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)local_19f8,
                                                  (
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)((long)&metavar_2._name.field_2 + 8));
                                              nonstd::optional_lite::
                                              optional<tinyusdz::ascii::AsciiParser::VariableDef>::
                                              ~optional((
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)((long)&metavar_2._name.field_2 + 8));
                                              bVar1 = nonstd::optional_lite::optional::
                                                      operator_cast_to_bool((optional *)local_19f8);
                                              if (bVar1) {
                                                MetaVariable::MetaVariable((MetaVariable *)&vardef);
                                                def = nonstd::optional_lite::
                                                                                                            
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  ::value((
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)local_19f8);
                                                bVar1 = ParseMetaValue(this,def,(MetaVariable *)
                                                                                &vardef);
                                                if (bVar1) {
                                                  MetaVariable::set_name
                                                            ((MetaVariable *)&vardef,
                                                             (string *)local_80);
                                                  pmVar5 = ::std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                  ::operator[](&out_meta->meta,(key_type *)local_80)
                                                  ;
                                                  MetaVariable::operator=
                                                            (pmVar5,(MetaVariable *)&vardef);
                                                }
                                                else {
                                                  this_local._7_1_ = 0;
                                                }
                                                varname.field_2._13_3_ = 0;
                                                varname.field_2._M_local_buf[0xc] = !bVar1;
                                                MetaVariable::~MetaVariable((MetaVariable *)&vardef)
                                                ;
                                                if (varname.field_2._12_4_ == 0) {
                                                  varname.field_2._12_4_ = 0;
                                                }
                                              }
                                              else {
                                                ::std::__cxx11::ostringstream::ostringstream
                                                          (local_1c20);
                                                poVar3 = ::std::operator<<((ostream *)local_1c20,
                                                                           "[error]");
                                                poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                                poVar3 = ::std::operator<<(poVar3,"[ASCII]");
                                                poVar3 = ::std::operator<<(poVar3,":");
                                                poVar3 = ::std::operator<<(poVar3,"ParseAttrMeta");
                                                poVar3 = ::std::operator<<(poVar3,"():");
                                                poVar3 = (ostream *)
                                                         ::std::ostream::operator<<(poVar3,0xd7e);
                                                ::std::operator<<(poVar3," ");
                                                ::std::allocator<char>::allocator();
                                                ::std::__cxx11::string::string
                                                          (local_1c60,
                                                                                                                      
                                                  "[InternalErrror] Failed to parse Property metadataum `{}`"
                                                  ,&local_1c61);
                                                fmt::format<std::__cxx11::string>
                                                          (local_1c40,(string *)local_1c60,
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80);
                                                poVar3 = ::std::operator<<((ostream *)local_1c20,
                                                                           (string *)local_1c40);
                                                ::std::operator<<(poVar3,"\n");
                                                ::std::__cxx11::string::~string
                                                          ((string *)local_1c40);
                                                ::std::__cxx11::string::~string(local_1c60);
                                                ::std::allocator<char>::~allocator
                                                          ((allocator<char> *)&local_1c61);
                                                ::std::__cxx11::ostringstream::str();
                                                PushError(this,&local_1c88);
                                                ::std::__cxx11::string::~string
                                                          ((string *)&local_1c88);
                                                this_local._7_1_ = 0;
                                                varname.field_2._12_4_ = 1;
                                                ::std::__cxx11::ostringstream::~ostringstream
                                                          (local_1c20);
                                              }
                                              nonstd::optional_lite::
                                              optional<tinyusdz::ascii::AsciiParser::VariableDef>::
                                              ~optional((
                                                  optional<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)local_19f8);
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            goto joined_r0x005549b4;
                          }
                          bVar1 = ReadBasicType(this,&local_58c);
                          if (!bVar1) {
                            ::std::__cxx11::ostringstream::ostringstream(local_708);
                            poVar3 = ::std::operator<<((ostream *)local_708,"[error]");
                            poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                            poVar3 = ::std::operator<<(poVar3,":");
                            poVar3 = ::std::operator<<(poVar3,"ParseAttrMeta");
                            poVar3 = ::std::operator<<(poVar3,"():");
                            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xd06);
                            ::std::operator<<(poVar3," ");
                            poVar3 = ::std::operator<<((ostream *)local_708,
                                                       "Failed to parse `elementSize`");
                            ::std::operator<<(poVar3,"\n");
                            ::std::__cxx11::ostringstream::str();
                            PushError(this,&local_728);
                            ::std::__cxx11::string::~string((string *)&local_728);
                            this_local._7_1_ = 0;
                            varname.field_2._12_4_ = 1;
                            ::std::__cxx11::ostringstream::~ostringstream(local_708);
                            goto LAB_00554fa9;
                          }
                          nonstd::optional_lite::optional<unsigned_int>::optional<unsigned_int_&,_0>
                                    ((optional<unsigned_int> *)((long)&tok.str_.field_2 + 8),
                                     &local_58c);
                          nonstd::optional_lite::optional<unsigned_int>::operator=
                                    (&out_meta->elementSize,
                                     (optional<unsigned_int> *)((long)&tok.str_.field_2 + 8));
                          nonstd::optional_lite::optional<unsigned_int>::~optional
                                    ((optional<unsigned_int> *)((long)&tok.str_.field_2 + 8));
                        }
LAB_00554f80:
                        bVar1 = SkipWhitespaceAndNewline(this,true);
                        if (bVar1) {
                          varname.field_2._12_4_ = 0;
                        }
                        else {
                          this_local._7_1_ = 0;
                          varname.field_2._12_4_ = 1;
                        }
                      }
                      else {
                        this_local._7_1_ = 0;
                        varname.field_2._12_4_ = 1;
                      }
                    }
                    else {
                      this_local._7_1_ = 0;
                      varname.field_2._12_4_ = 1;
                    }
                  }
                  else {
                    this_local._7_1_ = 0;
                    varname.field_2._12_4_ = 1;
                  }
                }
              }
            }
            else {
              this_local._7_1_ = 0;
              varname.field_2._12_4_ = 1;
            }
LAB_00554fa9:
            ::std::__cxx11::string::~string((string *)local_80);
          } while (varname.field_2._12_4_ == 0);
        }
        else {
          this_local._7_1_ = 0;
        }
      }
      else {
        StreamReader::seek_from_current(this->_sr,-1);
        this_local._7_1_ = 1;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseAttrMeta(AttrMeta *out_meta) {
  // '(' metas ')'
  //
  // currently we only support 'interpolation', 'elementSize' and 'cutomData'

  if (!SkipWhitespace()) {
    return false;
  }

  // The first character.
  {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '(') {
      // ok
    } else {
      _sr->seek_from_current(-1);

      // Still ok. No meta
      DCOUT("No attribute meta.");
      return true;
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == ')') {
      // end meta
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      // May be string only
      {
        value::StringData sdata;
        if (MaybeTripleQuotedString(&sdata)) {
          out_meta->stringData.push_back(sdata);

          DCOUT("Add triple-quoted string to attr meta:" << to_string(sdata));
          if (!SkipWhitespaceAndNewline()) {
            return false;
          }
          continue;
        } else if (MaybeString(&sdata)) {
          out_meta->stringData.push_back(sdata);

          DCOUT("Add string to attr meta:" << to_string(sdata));
          if (!SkipWhitespaceAndNewline()) {
            return false;
          }
          continue;
        }
      }

      std::string varname;
      if (!ReadIdentifier(&varname)) {
        return false;
      }

      DCOUT("Property/Attribute meta name: " << varname);

      bool supported = _supported_prop_metas.count(varname);
      if (!supported) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Unsupported Property metadatum name: {}", varname));
      }

      {
        std::string name_err;
        if (!pathutil::ValidatePropPath(Path("", varname), &name_err)) {
          PUSH_ERROR_AND_RETURN_TAG(
              kAscii,
              fmt::format("Invalid Property name `{}`: {}", varname, name_err));
        }
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }

      if (!Expect('=')) {
        return false;
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }

      //
      // First-class predefind prop metas.
      //
      if (varname == "interpolation") {
        std::string value;
        if (!ReadStringLiteral(&value)) {
          return false;
        }

        DCOUT("Got `interpolation` meta : " << value);
        out_meta->interpolation = InterpolationFromString(value);
      } else if (varname == "elementSize") {
        uint32_t value;
        if (!ReadBasicType(&value)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `elementSize`");
        }

        DCOUT("Got `elementSize` meta : " << value);
        out_meta->elementSize = value;
      } else if (varname == "colorSpace") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `colorSpace`");
        }
        // Add as custom meta value.
        MetaVariable metavar;
        metavar.set_value("colorSpace", tok);
        out_meta->meta["colorSpace"] = metavar;
      } else if (varname == "unauthoredValuesIndex") {
        int value;
        if (!ReadBasicType(&value)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `unauthoredValuesIndex`");
        }

        DCOUT("Got `unauthoredValuesIndex` meta : " << value);
        MetaVariable metavar;
        metavar.set_value("unauthoredValuesIndex", value);
        out_meta->meta["unauthoredValuesIndex"] = metavar;
      } else if (varname == "customData") {
        Dictionary dict;

        if (!ParseDict(&dict)) {
          return false;
        }

        DCOUT("Got `customData` meta");
        out_meta->customData = dict;

      } else if (varname == "weight") {
        double value;
        if (!ReadBasicType(&value)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `weight`");
        }

        DCOUT("Got `weight` meta : " << value);
        out_meta->weight = value;
      } else if (varname == "bindMaterialAs") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `bindMaterialAs`");
        }
        if ((tok.str() == kWeaderThanDescendants) ||
            (tok.str() == kStrongerThanDescendants)) {
          // ok
        } else {
          // still valid though
          PUSH_WARN("Unsupported token for bindMaterialAs: " << tok.str());
        }
        DCOUT("bindMaterialAs: " << tok);
        out_meta->bindMaterialAs = tok;
      } else if (varname == "displayName") {
        std::string str;
        if (!ReadStringLiteral(&str)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `displayName`(string type)");
        }
        DCOUT("displayName: " << str);
        out_meta->displayName = str;
      } else if (varname == "displayGroup") {
        std::string str;
        if (!ReadStringLiteral(&str)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `displayGroup`(string type)");
        }
        DCOUT("displayGroup: " << str);
        out_meta->displayGroup = str;

      } else if (varname == "connectability") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `connectability`");
        }
        DCOUT("connectability: " << tok);
        out_meta->connectability = tok;
      } else if (varname == "renderType") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `renderType`");
        }
        DCOUT("renderType: " << tok);
        out_meta->renderType = tok;
      } else if (varname == "outputName") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `outputName`");
        }
        DCOUT("outputName: " << tok);
        out_meta->outputName = tok;
      } else if (varname == "sdrMetadata") {
        Dictionary dict;

        if (!ParseDict(&dict)) {
          return false;
        }

        out_meta->sdrMetadata = dict;
      } else {
        if (auto pv = GetPropMetaDefinition(varname)) {
          // Parse as generic metadata variable
          MetaVariable metavar;
          const auto &vardef = pv.value();

          if (!ParseMetaValue(vardef, &metavar)) {
            return false;
          }
          metavar.set_name(varname);

          // add to custom meta
          out_meta->meta[varname] = metavar;

        } else {
          // This should not happen though.
          PUSH_ERROR_AND_RETURN_TAG(
              kAscii,
              fmt::format(
                  "[InternalErrror] Failed to parse Property metadataum `{}`",
                  varname));
        }
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }
    }
  }

  return true;
}